

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O3

bool __thiscall SQInstance::Get(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQClassMember *pSVar4;
  SQTable *pSVar5;
  SQWeakRef *pSVar6;
  bool bVar7;
  uint uVar8;
  SQObjectType SVar9;
  long *plVar10;
  ulong uVar11;
  
  bVar7 = SQTable::Get(this->_class->_members,key,val);
  if (bVar7) {
    pSVar3 = (val->super_SQObject)._unVal.pTable;
    uVar8 = (uint)pSVar3;
    if ((uVar8 >> 0x19 & 1) == 0) {
      pSVar4 = (this->_class->_methods)._vals;
      uVar11 = (ulong)((uVar8 & 0xffffff) << 5);
      SVar2 = (val->super_SQObject)._type;
      pSVar5 = *(SQTable **)((long)&(pSVar4->val).super_SQObject._unVal + uVar11);
      (val->super_SQObject)._unVal.pTable = pSVar5;
      SVar9 = *(SQObjectType *)((long)&(pSVar4->val).super_SQObject._type + uVar11);
      (val->super_SQObject)._type = SVar9;
      if ((SVar9 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
    }
    else {
      uVar8 = (uVar8 & 0xffffff) << 4;
      plVar10 = (long *)((long)&this->_values[0].super_SQObject._unVal + (ulong)uVar8);
      SVar9 = *(SQObjectType *)((long)&this->_values[0].super_SQObject._type + (ulong)uVar8);
      if (SVar9 == OT_WEAKREF) {
        SVar9 = *(SQObjectType *)(*plVar10 + 0x18);
        plVar10 = (long *)(*plVar10 + 0x20);
      }
      pSVar6 = (SQWeakRef *)*plVar10;
      SVar2 = (val->super_SQObject)._type;
      (val->super_SQObject)._unVal.pWeakRef = pSVar6;
      (val->super_SQObject)._type = SVar9;
      if ((SVar9 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar6->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar7;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val)  {
        if(_class->_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _values[_member_idx(val)];
                val = _realval(o);
            }
            else {
                val = _class->_methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }